

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O0

void __thiscall Timing::Save(Timing *this,string *filename)

{
  byte bVar1;
  char *pcVar2;
  E *this_00;
  string *arg;
  string *in_RSI;
  stringstream ss;
  ofstream fp;
  stringstream local_3a8 [16];
  ofstream *in_stack_fffffffffffffc68;
  Timing *in_stack_fffffffffffffc70;
  long local_210 [64];
  string *local_10;
  
  local_10 = in_RSI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar2,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    Save(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::ofstream::~ofstream(local_210);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3a8);
  this_00 = (E *)std::operator<<((ostream *)&stack0xfffffffffffffc68,
                                 "Timing::Save: failed to open file ");
  std::operator<<((ostream *)this_00,local_10);
  arg = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  E::E(this_00,arg);
  __cxa_throw(arg,&E::typeinfo,E::~E);
}

Assistant:

void Timing::Save(const string & filename) const
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "Timing::Save: failed to open file " << filename;
        throw(E(ss.str()));
    }

    Save(fp);
}